

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.cpp
# Opt level: O3

Var __thiscall Js::StreamReader::ReadHostObject(StreamReader *this)

{
  bool bVar1;
  ScriptContext *scriptContext;
  ThreadContext *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  void *__frameAddr;
  undefined1 local_50 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_50,scriptContext,&stack0xfffffffffffffff8
            );
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  iVar3 = (**this->m_stream->_vptr_HostReadStream)();
  ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
  pTVar2->reentrancySafeOrHandled = bVar1;
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)local_50);
  return (Var)CONCAT44(extraout_var,iVar3);
}

Assistant:

Var StreamReader::ReadHostObject()
    {
        Var object = nullptr;
        ScriptContext* scriptContext = GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            object = m_stream->ReadHostObject();
        }
        END_LEAVE_SCRIPT(scriptContext);
        return object;
    }